

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<double>
          (BasicWriter<wchar_t> *this,double value,FormatSpec *spec)

{
  void *__src;
  long lVar1;
  Alignment AVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  CharPtr pwVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  wchar_t wVar15;
  ulong uVar16;
  BasicWriter<wchar_t> *pBVar17;
  uint uVar18;
  wchar_t wVar19;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  wchar_t __tmp;
  wchar_t *pwVar23;
  long lVar24;
  ulong uVar25;
  byte bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar33 [16];
  wchar_t format [10];
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  wchar_t local_58 [10];
  
  bVar26 = spec->type_;
  uVar12 = bVar26 - 0x41;
  if (uVar12 < 0x27) {
    if ((0x71UL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar12 & 0x3f) & 1) == 0) goto LAB_00171878;
      goto LAB_001715ef;
    }
    bVar5 = true;
  }
  else {
LAB_00171878:
    if (bVar26 != 0) {
      internal::report_unknown_type
                ((char)((ulong)spec >> 0x38),
                 (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    bVar26 = 0x67;
LAB_001715ef:
    bVar5 = false;
  }
  if (0.0 <= value) {
    uVar12 = spec->flags_;
    wVar19 = L'+';
    if ((uVar12 & 2) == 0) {
      wVar19 = L' ';
    }
    if (NAN(value)) {
      if ((uVar12 & 1) == 0) {
        pcVar13 = " NAN";
        pcVar20 = " nan";
LAB_00171688:
        if (bVar5) {
          pcVar20 = pcVar13;
        }
        write_str<char>(this,pcVar20 + 1,3,&spec->super_AlignSpec);
        return;
      }
      pcVar13 = " NAN";
      pcVar20 = " nan";
      goto LAB_001716bb;
    }
    if (ABS(value) == INFINITY) {
      if ((uVar12 & 1) == 0) {
        pcVar13 = " INF";
        pcVar20 = " inf";
        goto LAB_00171688;
      }
      goto LAB_001716ad;
    }
    puVar10 = *(undefined8 **)(this + 8);
    lVar24 = puVar10[2];
    uVar18 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if ((uVar12 & 1) != 0) goto LAB_00171704;
    wVar19 = L'\0';
    bVar5 = true;
  }
  else {
    wVar19 = L'-';
    if (value <= -INFINITY) {
LAB_001716ad:
      pcVar13 = " INF";
      pcVar20 = " inf";
LAB_001716bb:
      if (bVar5) {
        pcVar20 = pcVar13;
      }
      pwVar9 = write_str<char>(this,pcVar20,4,&spec->super_AlignSpec);
      *pwVar9 = wVar19;
      return;
    }
    value = -value;
    puVar10 = *(undefined8 **)(this + 8);
    lVar24 = puVar10[2];
    uVar18 = (spec->super_AlignSpec).super_WidthSpec.width_;
    wVar19 = L'-';
LAB_00171704:
    if ((ulong)puVar10[3] < (ulong)(uVar18 + (uVar18 == 0)) + lVar24) {
      (**(code **)*puVar10)(puVar10);
    }
    bVar27 = uVar18 == 0;
    uVar18 = uVar18 - 1;
    bVar5 = false;
    if (bVar27) {
      uVar18 = 0;
    }
    lVar24 = lVar24 + 1;
    uVar12 = spec->flags_;
  }
  pBVar17 = this + 8;
  local_58[0] = L'%';
  if ((uVar12 & 8) == 0) {
    pwVar23 = local_58 + 1;
  }
  else {
    pwVar23 = local_58 + 2;
    local_58[1] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 != ALIGN_CENTER) {
    if (AVar2 == ALIGN_LEFT) {
      *pwVar23 = L'-';
      pwVar23 = pwVar23 + 1;
    }
    if (uVar18 != 0) {
      *pwVar23 = L'*';
      pwVar23 = pwVar23 + 1;
      goto LAB_00171790;
    }
  }
  uVar18 = 0;
LAB_00171790:
  iVar30 = spec->precision_;
  if (-1 < iVar30) {
    pwVar23[0] = L'.';
    pwVar23[1] = L'*';
    pwVar23 = pwVar23 + 2;
  }
  *pwVar23 = (uint)bVar26;
  pwVar23[1] = L'\0';
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  do {
    pwVar23 = (wchar_t *)(*(long *)(*(long *)pBVar17 + 8) + lVar24 * 4);
    uVar12 = internal::CharTraits<wchar_t>::format_float<double>
                       (pwVar23,*(long *)(*(long *)pBVar17 + 0x18) - lVar24,local_58,uVar18,iVar30,
                        value);
    if ((int)uVar12 < 0) {
      puVar10 = *(undefined8 **)pBVar17;
      if (puVar10[3] != -1) {
        uVar21 = puVar10[3] + 1;
        puVar11 = (undefined8 *)*puVar10;
        goto LAB_00171836;
      }
    }
    else {
      puVar10 = *(undefined8 **)pBVar17;
      uVar16 = puVar10[3];
      if ((ulong)uVar12 + lVar24 < uVar16) break;
      uVar21 = (ulong)uVar12 + lVar24 + 1;
      if (uVar16 < uVar21) {
        puVar11 = (undefined8 *)*puVar10;
LAB_00171836:
        (*(code *)*puVar11)(puVar10,uVar21);
      }
    }
    iVar30 = spec->precision_;
  } while( true );
  AVar2 = (spec->super_AlignSpec).align_;
  if (bVar5) {
    wVar19 = L'\0';
    goto LAB_001718a8;
  }
  if (AVar2 == ALIGN_RIGHT) {
    wVar4 = *pwVar23;
joined_r0x00171899:
    wVar15 = wVar3;
    if (wVar4 != L' ') goto LAB_0017189b;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      wVar4 = *pwVar23;
      goto joined_r0x00171899;
    }
LAB_0017189b:
    wVar15 = wVar19 & 0xff;
    wVar19 = L'\0';
  }
  pwVar23[-1] = wVar15;
  uVar12 = uVar12 + 1;
LAB_001718a8:
  if (AVar2 == ALIGN_CENTER) {
    uVar18 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar12 < uVar18) {
      lVar24 = puVar10[2];
      uVar21 = lVar24 + (ulong)uVar18;
      puVar11 = puVar10;
      if (uVar16 < uVar21) {
        (**(code **)*puVar10)(puVar10,uVar21);
        puVar11 = *(undefined8 **)pBVar17;
      }
      puVar10[2] = uVar21;
      lVar14 = puVar11[1];
      __src = (void *)(lVar14 + lVar24 * 4);
      uVar25 = (ulong)uVar12;
      memmove((void *)((long)__src + (ulong)(uVar18 - uVar12 >> 1) * 4),__src,uVar25 * 4);
      auVar8 = _DAT_00180e00;
      auVar7 = _DAT_0017cac0;
      auVar6 = _DAT_0017cab0;
      uVar18 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar16 = uVar18 - uVar25;
      uVar21 = uVar16 >> 1;
      if (1 < uVar16) {
        uVar16 = uVar21 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar28._8_4_ = (int)uVar16;
        auVar28._0_8_ = uVar16;
        auVar28._12_4_ = (int)(uVar16 >> 0x20);
        lVar1 = lVar14 + lVar24 * 4;
        lVar22 = 0;
        auVar28 = auVar28 ^ _DAT_0017cac0;
        do {
          auVar31._8_4_ = (int)lVar22;
          auVar31._0_8_ = lVar22;
          auVar31._12_4_ = (int)((ulong)lVar22 >> 0x20);
          auVar33 = (auVar31 | auVar6) ^ auVar7;
          iVar30 = auVar28._4_4_;
          if ((bool)(~(auVar33._4_4_ == iVar30 && auVar28._0_4_ < auVar33._0_4_ ||
                      iVar30 < auVar33._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar22 * 4) = wVar3;
          }
          if ((auVar33._12_4_ != auVar28._12_4_ || auVar33._8_4_ <= auVar28._8_4_) &&
              auVar33._12_4_ <= auVar28._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar22 * 4) = wVar3;
          }
          auVar31 = (auVar31 | auVar8) ^ auVar7;
          iVar34 = auVar31._4_4_;
          if (iVar34 <= iVar30 && (iVar34 != iVar30 || auVar31._0_4_ <= auVar28._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar22 * 4) = wVar3;
            *(wchar_t *)(lVar1 + 0xc + lVar22 * 4) = wVar3;
          }
          lVar22 = lVar22 + 4;
        } while ((uVar16 - ((uint)(uVar21 + 0x3fffffffffffffff) & 3)) + 4 != lVar22);
      }
      auVar8 = _DAT_00180e00;
      auVar7 = _DAT_0017cac0;
      auVar6 = _DAT_0017cab0;
      if (uVar18 == uVar12) {
        return;
      }
      uVar16 = ((ulong)uVar18 * 4 + (uVar21 + uVar25) * -4) - 4;
      auVar33._8_4_ = (int)uVar16;
      auVar33._0_8_ = uVar16;
      auVar33._12_4_ = (int)(uVar16 >> 0x20);
      auVar29._0_8_ = uVar16 >> 2;
      auVar29._8_8_ = auVar33._8_8_ >> 2;
      lVar14 = uVar21 * 4 + lVar24 * 4 + uVar25 * 4 + lVar14;
      uVar21 = 0;
      auVar29 = auVar29 ^ _DAT_0017cac0;
      do {
        auVar32._8_4_ = (int)uVar21;
        auVar32._0_8_ = uVar21;
        auVar32._12_4_ = (int)(uVar21 >> 0x20);
        auVar28 = (auVar32 | auVar6) ^ auVar7;
        iVar30 = auVar29._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar30 && auVar29._0_4_ < auVar28._0_4_ ||
                    iVar30 < auVar28._4_4_) & 1)) {
          *(wchar_t *)(lVar14 + uVar21 * 4) = wVar3;
        }
        if ((auVar28._12_4_ != auVar29._12_4_ || auVar28._8_4_ <= auVar29._8_4_) &&
            auVar28._12_4_ <= auVar29._12_4_) {
          *(wchar_t *)(lVar14 + 4 + uVar21 * 4) = wVar3;
        }
        auVar28 = (auVar32 | auVar8) ^ auVar7;
        iVar34 = auVar28._4_4_;
        if (iVar34 <= iVar30 && (iVar34 != iVar30 || auVar28._0_4_ <= auVar29._0_4_)) {
          *(wchar_t *)(lVar14 + 8 + uVar21 * 4) = wVar3;
          *(wchar_t *)(lVar14 + 0xc + uVar21 * 4) = wVar3;
        }
        uVar21 = uVar21 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar21);
      return;
    }
  }
  if (((char)wVar19 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    wVar4 = *pwVar23;
    while (wVar4 == L' ') {
      *pwVar23 = wVar3;
      wVar4 = pwVar23[1];
      pwVar23 = pwVar23 + 1;
    }
    if ((char)wVar19 != '\0') {
      pwVar23[-1] = wVar19 & 0xff;
    }
  }
  uVar21 = (ulong)uVar12 + puVar10[2];
  if (uVar16 < uVar21) {
    (**(code **)*puVar10)(puVar10,uVar21);
  }
  puVar10[2] = uVar21;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}